

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

void stmm_clean(stmm_table *table)

{
  int iVar1;
  long lVar2;
  
  iVar1 = table->num_bins;
  for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
    table->bins[lVar2] = (stmm_table_entry *)0x0;
  }
  table->num_entries = 0;
  Extra_MmFixedRestart((Extra_MmFixed_t *)table->pMemMan);
  return;
}

Assistant:

void
stmm_clean (stmm_table *table)
{
    int i;
    // clean the bins
    for (i = 0; i < table->num_bins; i++)
        table->bins[i] = NULL;
    // reset the parameters
    table->num_entries = 0;
    // restart the memory manager
    Extra_MmFixedRestart ((Extra_MmFixed_t *)table->pMemMan);
}